

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O3

int __thiscall
Lib::List<Inferences::ALASCA::SuperpositionConf::Rhs>::remove
          (List<Inferences::ALASCA::SuperpositionConf::Rhs> *this,char *__filename)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  if (__filename == (char *)0x0) {
    __filename = (char *)0x0;
  }
  else {
    uVar1 = (((this->_head).super_SelectedLiteral.cl)->super_Unit)._number;
    uVar2 = (this->_head).super_SelectedLiteral.litIdx;
    pcVar6 = *(char **)(__filename + 0x48);
    if ((**(uint **)__filename == uVar1) && (*(uint *)(__filename + 8) == uVar2)) {
LAB_0038384f:
      operator_delete(__filename,8);
      __filename = pcVar6;
    }
    else if (pcVar6 != (char *)0x0) {
      uVar3 = **(uint **)pcVar6;
      pcVar5 = __filename;
      while( true ) {
        pcVar4 = pcVar6;
        if ((uVar3 == uVar1) && (*(uint *)(pcVar4 + 8) == uVar2)) {
          *(undefined8 *)(pcVar5 + 0x48) = *(undefined8 *)(pcVar4 + 0x48);
          pcVar6 = __filename;
          __filename = pcVar4;
          goto LAB_0038384f;
        }
        pcVar6 = *(char **)(pcVar4 + 0x48);
        if (pcVar6 == (char *)0x0) break;
        uVar3 = **(uint **)pcVar6;
        pcVar5 = pcVar4;
      }
    }
  }
  return (int)__filename;
}

Assistant:

static bool isEmpty (const List* l)
  {
    return l == 0;
  }